

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O1

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint j;
  long lVar7;
  long lVar8;
  char (*pacVar9) [20];
  char *pcVar10;
  char *pcVar11;
  int m;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  char aBind [256];
  char aBuffer [512];
  char local_338 [256];
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar10 = (char *)((long)pUserData + 0x29);
  lVar13 = 0;
  do {
    lVar1 = lVar13 * 0x200 + 0x28;
    lVar12 = 0;
    pcVar11 = pcVar10;
    do {
      if (*(char *)((long)pUserData + lVar12 * 0x80 + lVar1) != '\0') {
        cVar2 = *(char *)((long)pUserData + lVar12 * 0x80 + lVar1);
        pcVar5 = local_338;
        if (cVar2 != '\0') {
          lVar7 = 0;
          pcVar4 = pcVar11;
          do {
            if ((cVar2 == '\\') || (lVar8 = lVar7, cVar2 == '\"')) {
              lVar8 = lVar7 + 1;
              *pcVar5 = '\\';
            }
            pcVar5 = local_338 + lVar8 + 1;
            local_338[lVar8] = cVar2;
            cVar2 = *pcVar4;
            if (cVar2 == '\0') break;
            lVar7 = lVar8 + 1;
            pcVar4 = pcVar4 + 1;
          } while (lVar8 < 0xfe);
        }
        *pcVar5 = '\0';
        uVar3 = (int)lVar12 - 1;
        pcVar5 = "";
        if (uVar3 < 3) {
          pcVar5 = (&PTR_anon_var_dwarf_3dcb4_00213980)[uVar3];
        }
        str_format(local_238,0x200,"bind %s%s \"%s\"",pcVar5,g_aaKeyStrings + lVar13,local_338);
        (*(pConfigManager->super_IInterface)._vptr_IInterface[8])();
      }
      lVar12 = lVar12 + 1;
      pcVar11 = pcVar11 + 0x80;
    } while (lVar12 != 4);
    lVar13 = lVar13 + 1;
    pcVar10 = pcVar10 + 0x200;
    if (lVar13 == 0x1da) {
      lVar13 = 0;
      do {
        uVar3 = s_aaDefaultBindKeys[lVar13][0];
        if (*(char *)((long)pUserData +
                     (long)s_aaDefaultBindKeys[lVar13][1] * 0x80 + (long)(int)uVar3 * 0x200 + 0x28)
            == '\0') {
          uVar6 = s_aaDefaultBindKeys[lVar13][1] - 1;
          pcVar10 = "";
          if (uVar6 < 3) {
            pcVar10 = (&PTR_anon_var_dwarf_3dcb4_00213980)[uVar6];
          }
          pacVar9 = g_aaKeyStrings + (int)uVar3;
          if (0x1ff < uVar3) {
            pacVar9 = g_aaKeyStrings;
          }
          str_format(local_238,0x200,"unbind %s%s",pcVar10,pacVar9);
          (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_238);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x1d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CBinds *pSelf = (CBinds *)pUserData;

	char aBuffer[512];
	for(int i = 0; i < KEY_LAST; i++)
	{
		for(int m = 0; m < MODIFIER_COUNT; m++)
		{
			if(pSelf->m_aaaKeyBindings[i][m][0] == 0)
				continue;

			// process the string. we need to escape some characters
			char aBind[2*BIND_LENGTH];
			const char *pSrc = pSelf->m_aaaKeyBindings[i][m];
			const char *pEnd = aBind + sizeof(aBind) - 1;
			char *pDst = aBind;
			while(*pSrc && pDst < pEnd)
			{
				if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
					*pDst++ = '\\';
				*pDst++ = *pSrc++;
			}
			*pDst = 0;

			str_format(aBuffer, sizeof(aBuffer), "bind %s%s \"%s\"", GetModifierName(m), pSelf->Input()->KeyName(i), aBind);
			pConfigManager->WriteLine(aBuffer);
		}
	}

	for(unsigned j = 0; j < sizeof(s_aaDefaultBindKeys)/sizeof(int)/2; j++)
	{
		const int Key = s_aaDefaultBindKeys[j][0];
		const int Modifier = s_aaDefaultBindKeys[j][1];
		if(pSelf->m_aaaKeyBindings[Key][Modifier][0] == 0)
		{
			// explicitly unbind keys that were unbound by the user
			str_format(aBuffer, sizeof(aBuffer), "unbind %s%s", GetModifierName(Modifier), pSelf->Input()->KeyName(Key));
			pConfigManager->WriteLine(aBuffer);
		}
	}
}